

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

stacktrace * __thiscall
cpptrace::detail::lazy_trace_holder::get_resolved_trace(lazy_trace_holder *this)

{
  bool bVar1;
  exception *e;
  stacktrace local_68;
  lazy_trace_holder local_48;
  undefined1 local_28 [8];
  raw_trace old_trace;
  lazy_trace_holder *this_local;
  
  if ((this->resolved & 1U) == 0) {
    old_trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    raw_trace::raw_trace((raw_trace *)local_28,&(this->field_1).trace);
    local_68.frames.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.frames.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.frames.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::vector
              (&local_68.frames);
    lazy_trace_holder(&local_48,&local_68);
    operator=(this,&local_48);
    ~lazy_trace_holder(&local_48);
    stacktrace::~stacktrace(&local_68);
    bVar1 = raw_trace::empty((raw_trace *)local_28);
    if (!bVar1) {
      raw_trace::resolve((stacktrace *)&e,(raw_trace *)local_28);
      stacktrace::operator=(&(this->field_1).resolved_trace,(stacktrace *)&e);
      stacktrace::~stacktrace((stacktrace *)&e);
    }
    raw_trace::~raw_trace((raw_trace *)local_28);
  }
  return (stacktrace *)&this->field_1;
}

Assistant:

stacktrace& lazy_trace_holder::get_resolved_trace() {
            if(!resolved) {
                raw_trace old_trace = std::move(trace);
                *this = lazy_trace_holder(stacktrace{});
                try {
                    if(!old_trace.empty()) {
                        resolved_trace = old_trace.resolve();
                    }
                } catch(const std::exception& e) {
                    if(!detail::should_absorb_trace_exceptions()) {
                        // TODO: Append to message somehow?
                        std::fprintf(
                            stderr,
                            "Exception occurred while resolving trace in cpptrace::detail::lazy_trace_holder:\n%s\n",
                            e.what()
                        );
                    }
                }
            }
            return resolved_trace;
        }